

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::IFF_Layer3Transponder
          (IFF_Layer3Transponder *this,SimulationIdentifier *ReportingSimulation,
          Mode5TransponderBasicData *Data,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *Records)

{
  KUINT16 KVar1;
  undefined2 uVar2;
  KUINT32 KVar3;
  KUINT8 KVar4;
  
  IFF_Layer3::IFF_Layer3(&this->super_IFF_Layer3);
  (this->super_IFF_Layer3).super_LayerHeader.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer3Transponder_00226a20;
  Mode5TransponderBasicData::Mode5TransponderBasicData(&this->m_BasicData);
  KVar1 = ReportingSimulation->m_ui16ApplicationID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16SiteID = ReportingSimulation->m_ui16SiteID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16ApplicationID = KVar1;
  (this->m_BasicData).m_Status.m_StatusUnion = (Data->m_Status).m_StatusUnion;
  uVar2 = *(undefined2 *)&Data->field_0x1a;
  KVar3 = Data->m_ui32MsgFormats;
  (this->m_BasicData).m_ui16PIN = Data->m_ui16PIN;
  *(undefined2 *)&(this->m_BasicData).field_0x1a = uVar2;
  (this->m_BasicData).m_ui32MsgFormats = KVar3;
  (this->m_BasicData).m_EM1Code.super_ModeXCodeRecord.m_CodeUnion =
       (Data->m_EM1Code).super_ModeXCodeRecord.m_CodeUnion;
  (this->m_BasicData).m_ui16NationalOrigin = Data->m_ui16NationalOrigin;
  (this->m_BasicData).m_SupplementalData.m_SupplementalDataUnion =
       (Data->m_SupplementalData).m_SupplementalDataUnion;
  KVar4 = Data->m_ui8FigMerit;
  (this->m_BasicData).m_ui8NavSrc = Data->m_ui8NavSrc;
  (this->m_BasicData).m_ui8FigMerit = KVar4;
  (this->m_BasicData).m_ui8Padding = Data->m_ui8Padding;
  IFF_Layer3::SetDataRecords(&this->super_IFF_Layer3,Records);
  return;
}

Assistant:

IFF_Layer3Transponder::IFF_Layer3Transponder( const SimulationIdentifier & ReportingSimulation, const Mode5TransponderBasicData & Data,
                                              std::vector<StdVarPtr> & Records ) 
{
    m_RptSim = ReportingSimulation;
    m_BasicData = Data;
    SetDataRecords( Records );
}